

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O1

VkClearValue
vkt::api::anon_unknown_0::makeClearColorValue(VkFormat format,float r,float g,float b,float a)

{
  TextureChannelClass TVar1;
  ulong in_RCX;
  ulong uVar2;
  ulong extraout_RDX;
  ulong in_RSI;
  ulong uVar3;
  float fVar4;
  VkClearValue VVar5;
  TextureFormat tcuFormat;
  UVec4 maxValues;
  TextureFormat local_30;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_28 = r;
  local_24 = g;
  local_20 = b;
  local_1c = a;
  local_30 = ::vk::mapVkFormat(format);
  TVar1 = tcu::getTextureChannelClass(local_30.type);
  if (TVar1 != TEXTURECHANNELCLASS_FLOATING_POINT) {
    TVar1 = tcu::getTextureChannelClass(local_30.type);
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      TVar1 = tcu::getTextureChannelClass(local_30.type);
      if (TVar1 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        TVar1 = tcu::getTextureChannelClass(local_30.type);
        if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
          tcu::getFormatMaxUintValue((tcu *)&local_18,&local_30);
          local_28 = (float)local_18 * local_28;
          local_24 = (float)local_14 * local_24;
          local_20 = (float)local_10 * local_20;
          fVar4 = (float)local_c;
        }
        else {
          uVar3 = (ulong)local_30.type;
          TVar1 = tcu::getTextureChannelClass(local_30.type);
          uVar2 = extraout_RDX;
          if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_0045d6c6;
          tcu::getFormatMaxIntValue((tcu *)&local_18,&local_30);
          local_28 = (float)(int)local_18 * local_28;
          local_24 = (float)(int)local_14 * local_24;
          local_20 = (float)(int)local_10 * local_20;
          fVar4 = (float)(int)local_c;
        }
        in_RSI = (ulong)local_20;
        uVar2 = (ulong)local_24;
        in_RCX = (ulong)local_28;
        uVar3 = (ulong)(fVar4 * local_1c);
        goto LAB_0045d6c6;
      }
    }
  }
  in_RCX = (ulong)(uint)local_28;
  uVar2 = (ulong)(uint)local_24;
  in_RSI = (ulong)(uint)local_20;
  uVar3 = (ulong)(uint)local_1c;
LAB_0045d6c6:
  VVar5._0_8_ = in_RCX & 0xffffffff | uVar2 << 0x20;
  VVar5._8_8_ = in_RSI & 0xffffffff | uVar3 << 0x20;
  return VVar5;
}

Assistant:

VkClearValue makeClearColorValue (VkFormat format, float r, float g, float b, float a)
{
	const	TextureFormat tcuFormat	= mapVkFormat(format);
	VkClearValue clearValue;

	if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_FLOATING_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
	{
		clearValue.color.float32[0] = r;
		clearValue.color.float32[1] = g;
		clearValue.color.float32[2] = b;
		clearValue.color.float32[3] = a;
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		UVec4 maxValues = getFormatMaxUintValue(tcuFormat);

		clearValue.color.uint32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.uint32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.uint32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.uint32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		IVec4 maxValues = getFormatMaxIntValue(tcuFormat);

		clearValue.color.int32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.int32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.int32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.int32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else
		DE_FATAL("Unknown channel class");

	return clearValue;
}